

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O2

void __thiscall aeron::ClientConductor::releaseCounter(ClientConductor *this,int64_t registrationId)

{
  pointer pCVar1;
  long lVar2;
  long lVar3;
  const_iterator __position;
  
  verifyDriverIsActiveViaErrorHandler(this);
  std::recursive_mutex::lock(&this->m_adminLock);
  __position._M_current =
       (this->m_counters).
       super__Vector_base<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->m_counters).
           super__Vector_base<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pCVar1 - (long)__position._M_current;
  for (lVar2 = lVar3 / 0x60 >> 2; 0 < lVar2; lVar2 = lVar2 + -1) {
    if ((__position._M_current)->m_registrationId == registrationId) goto LAB_0014b29a;
    if (__position._M_current[1].m_registrationId == registrationId) {
      __position._M_current = __position._M_current + 1;
      goto LAB_0014b29a;
    }
    if (__position._M_current[2].m_registrationId == registrationId) {
      __position._M_current = __position._M_current + 2;
      goto LAB_0014b29a;
    }
    if (__position._M_current[3].m_registrationId == registrationId) {
      __position._M_current = __position._M_current + 3;
      goto LAB_0014b29a;
    }
    __position._M_current = __position._M_current + 4;
    lVar3 = lVar3 + -0x180;
  }
  lVar3 = lVar3 / 0x60;
  if (lVar3 == 1) {
LAB_0014b27b:
    if ((__position._M_current)->m_registrationId != registrationId) {
      __position._M_current = pCVar1;
    }
  }
  else if (lVar3 == 2) {
LAB_0014b272:
    if ((__position._M_current)->m_registrationId != registrationId) {
      __position._M_current = __position._M_current + 1;
      goto LAB_0014b27b;
    }
  }
  else {
    if (lVar3 != 3) goto LAB_0014b2ba;
    if ((__position._M_current)->m_registrationId != registrationId) {
      __position._M_current = __position._M_current + 1;
      goto LAB_0014b272;
    }
  }
LAB_0014b29a:
  if (__position._M_current != pCVar1) {
    DriverProxy::removeCounter(this->m_driverProxy,(__position._M_current)->m_registrationId);
    std::
    vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
    ::erase(&this->m_counters,__position);
  }
LAB_0014b2ba:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::releaseCounter(std::int64_t registrationId)
{
    verifyDriverIsActiveViaErrorHandler();

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(
        m_counters.begin(),
        m_counters.end(),
        [registrationId](const CounterStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (it != m_counters.end())
    {
        m_driverProxy.removeCounter((*it).m_registrationId);

        m_counters.erase(it);
    }
}